

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

wstring * __thiscall
mjs::strip_format_control_characters_abi_cxx11_
          (wstring *__return_storage_ptr__,mjs *this,wstring_view *s)

{
  classification cVar1;
  long lVar2;
  uint *__value;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  __value = *(uint **)(this + 8);
  lVar2 = *(long *)this << 2;
  local_28.container = __return_storage_ptr__;
  do {
    if (lVar2 == 0) {
      return __return_storage_ptr__;
    }
    if (*__value < 0xad) {
LAB_0015a45b:
      std::
      back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::operator=(&local_28,(value_type *)__value);
    }
    else {
      cVar1 = anon_unknown_2::classify(*__value);
      if (cVar1 != format) goto LAB_0015a45b;
    }
    __value = __value + 1;
    lVar2 = lVar2 + -4;
  } while( true );
}

Assistant:

std::wstring strip_format_control_characters(const std::wstring_view& s) {
    std::wstring res;
    res.reserve(s.size());
    std::copy_if(s.begin(), s.end(), std::back_inserter(res), [](auto ch) { return !is_form_control(ch); });
    return res;
}